

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

LValue * __thiscall
slang::ast::ConcatenationExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,ConcatenationExpression *this,EvalContext *context)

{
  size_t sVar1;
  pointer ppEVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  long lVar6;
  LValue lval;
  vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> local_1d8;
  _Variadic_union<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat> local_1b8;
  char local_38;
  
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::reserve
            (&local_1d8,(this->operands_)._M_extent._M_extent_value);
  sVar1 = (this->operands_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->operands_)._M_ptr;
    lVar6 = 0;
    do {
      Expression::evalLValue((LValue *)&local_1b8,*(Expression **)((long)ppEVar2 + lVar6),context);
      if (local_38 == '\0') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
         + 0x180) = '\0';
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                             *)&local_1b8);
        goto LAB_0042f95c;
      }
      std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::
      emplace_back<slang::ast::LValue>(&local_1d8,(LValue *)&local_1b8);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                           *)&local_1b8);
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  pLVar5 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  pLVar4 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar3 = local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._24_4_ = 0;
  *(pointer *)
   &(__return_storage_ptr__->value).
    super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>.
    super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
       = pLVar3;
  *(pointer *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 8) = pLVar4;
  *(pointer *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x10) = pLVar5;
  local_1b8._16_8_ = 0;
  local_1b8._0_8_ = 0;
  local_1b8._8_8_ = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x18) = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x180) = '\x02';
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector
            ((vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_> *)&local_1b8);
LAB_0042f95c:
  std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>::~vector(&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

LValue ConcatenationExpression::evalLValueImpl(EvalContext& context) const {
    std::vector<LValue> lvals;
    lvals.reserve(operands().size());
    for (auto operand : operands()) {
        LValue lval = operand->evalLValue(context);
        if (!lval)
            return nullptr;

        lvals.emplace_back(std::move(lval));
    }

    return LValue(std::move(lvals), LValue::Concat::Packed);
}